

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::
option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~option_with_value
          (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_00123ab0;
  std::__cxx11::string::~string((string *)&this->actual);
  std::__cxx11::string::~string((string *)&this->def);
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->nam);
  return;
}

Assistant:

~option_with_value() {}